

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::readLinearizationData(QPDF *this)

{
  int iVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  BitStream h;
  BitStream h_00;
  BitStream h_01;
  Pipeline *pl;
  bool bVar3;
  int iVar4;
  int iVar5;
  element_type *peVar6;
  reference pvVar7;
  longlong lVar8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar9;
  uchar *p;
  size_t nbytes;
  unsigned_long uVar10;
  QPDFExc *pQVar11;
  logic_error *this_00;
  long lVar12;
  BitStream *this_01;
  value_type vVar13;
  allocator<char> local_211;
  Pipeline *local_210;
  string local_208;
  int HOi;
  allocator<char> local_1e1;
  Pl_Buffer pb;
  int HSi;
  int H1_length;
  int H0_length;
  QPDFObjectHandle H0;
  vector<int,_std::allocator<int>_> H_items;
  QPDFObjectHandle oh;
  QPDFObjectHandle P;
  QPDFObjectHandle HO;
  QPDFObjectHandle N;
  QPDFObjectHandle H;
  QPDFObjectHandle HS;
  QPDFObjectHandle T;
  QPDFObjectHandle E;
  QPDFObjectHandle O;
  shared_ptr<Buffer> hbp;
  QPDF local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  BitStream local_a8;
  BitStream local_80;
  BitStream local_58;
  
  bVar3 = isLinearized(this);
  if (!bVar3) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"called readLinearizationData for file that is not linearized");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/H",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&H,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/O",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&O,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/E",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&E,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/N",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&N,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/T",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&T,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"/P",(allocator<char> *)&local_208);
  QPDFObjectHandle::getKey(&P,(string *)&(_Var2._M_head_impl)->lindict);
  std::__cxx11::string::~string((string *)&pb);
  bVar3 = QPDFObjectHandle::isArray(&H);
  if (bVar3) {
    bVar3 = QPDFObjectHandle::isInteger(&O);
    if (bVar3) {
      bVar3 = QPDFObjectHandle::isInteger(&E);
      if (bVar3) {
        bVar3 = QPDFObjectHandle::isInteger(&N);
        if (bVar3) {
          bVar3 = QPDFObjectHandle::isInteger(&T);
          if (bVar3) {
            bVar3 = QPDFObjectHandle::isInteger(&P);
            if (!bVar3) {
              bVar3 = QPDFObjectHandle::isNull(&P);
              if (!bVar3) goto LAB_001d3c79;
            }
            pb.super_Pipeline._vptr_Pipeline._0_4_ = QPDFObjectHandle::getArrayNItems(&H);
            peVar6 = (element_type *)
                     QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&pb);
            local_210 = (Pipeline *)this;
            if ((peVar6 != (element_type *)0x2) && (peVar6 != (element_type *)0x4)) {
              pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pb,"linearization dictionary",(allocator<char> *)&oh);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_208,"H has the wrong number of items",
                         (allocator<char> *)&H_items);
              damagedPDF(pQVar11,(QPDF *)local_210,(string *)&pb,&local_208);
              __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            for (H0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr = (element_type *)0x0;
                H0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr < peVar6;
                H0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         ((long)&((H0.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  )->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 1)) {
              QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&H0);
              QPDFObjectHandle::getArrayItem(&oh,(int)&H);
              bVar3 = QPDFObjectHandle::isInteger(&oh);
              if (!bVar3) {
                pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pb,"linearization dictionary",(allocator<char> *)&HS);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_208,"some H items are of the wrong type",
                           (allocator<char> *)&HO);
                damagedPDF(pQVar11,(QPDF *)local_210,(string *)&pb,&local_208);
                __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
              }
              pb.super_Pipeline._vptr_Pipeline._0_4_ = QPDFObjectHandle::getIntValueAsInt(&oh);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(&H_items,(int *)&pb);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&oh.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            }
            pvVar7 = std::vector<int,_std::allocator<int>_>::at(&H_items,0);
            iVar1 = *pvVar7;
            pvVar7 = std::vector<int,_std::allocator<int>_>::at(&H_items,1);
            H0_length = *pvVar7;
            H1_length = 0;
            vVar13 = 0;
            if ((long)H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::at(&H_items,2);
              vVar13 = *pvVar7;
              pvVar7 = std::vector<int,_std::allocator<int>_>::at(&H_items,3);
              H1_length = *pvVar7;
            }
            bVar3 = QPDFObjectHandle::isInteger(&P);
            iVar4 = 0;
            if (bVar3) {
              iVar4 = QPDFObjectHandle::getIntValueAsInt(&P);
            }
            lVar8 = QPDFObjectHandle::getIntValue(&N);
            pvVar9 = getAllPages((QPDF *)local_210);
            if (lVar8 != (long)(pvVar9->
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar9->
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4) {
              pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pb,"linearization hint table",(allocator<char> *)&oh);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_208,"/N does not match number of pages",
                         (allocator<char> *)&H0);
              damagedPDF(pQVar11,(QPDF *)local_210,(string *)&pb,&local_208);
              __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            iVar5 = QPDFObjectHandle::getIntValueAsInt(&O);
            *(int *)((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                              &local_210->_vptr_Pipeline)->_M_t).
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp + 8)
                 = iVar5;
            lVar8 = QPDFObjectHandle::getIntValue(&E);
            *(longlong *)
             ((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                       &local_210->_vptr_Pipeline)->_M_t).
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp + 0x10) =
                 lVar8;
            iVar5 = QPDFObjectHandle::getIntValueAsInt(&N);
            *(int *)((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                              &local_210->_vptr_Pipeline)->_M_t).
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp +
                    0x18) = iVar5;
            lVar8 = QPDFObjectHandle::getIntValue(&T);
            _Var2._M_head_impl =
                 (((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                  &local_210->_vptr_Pipeline)->_M_t).
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            *(longlong *)((long)&(_Var2._M_head_impl)->linp + 0x20) = lVar8;
            *(int *)((long)&(_Var2._M_head_impl)->linp + 0x28) = iVar4;
            *(long *)((long)&(_Var2._M_head_impl)->linp + 0x30) = (long)iVar1;
            *(long *)((long)&(_Var2._M_head_impl)->linp + 0x38) = (long)H0_length;
            Pl_Buffer::Pl_Buffer(&pb,"hint buffer",(Pipeline *)0x0);
            QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&H0_length);
            pl = local_210;
            readHintStream((QPDF *)&H0,local_210,(qpdf_offset_t)&pb,(long)iVar1);
            if (vVar13 != 0) {
              QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&H1_length);
              readHintStream(&local_b8,pl,(qpdf_offset_t)&pb,(long)vVar13);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"/S",(allocator<char> *)&oh);
            QPDFObjectHandle::getKey(&HS,(string *)&H0);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"/O",(allocator<char> *)&oh);
            QPDFObjectHandle::getKey(&HO,(string *)&H0);
            std::__cxx11::string::~string((string *)&local_208);
            Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)&hbp);
            p = Buffer::getBuffer(hbp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            nbytes = Buffer::getSize(hbp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
            BitStream::BitStream(&local_58,p,nbytes);
            h.nbytes = local_58.nbytes;
            h.start = local_58.start;
            h.p = local_58.p;
            h.bit_offset = local_58.bit_offset;
            h.bits_available = local_58.bits_available;
            readHPageOffset((QPDF *)pl,h);
            HSi = QPDFObjectHandle::getIntValueAsInt(&HS);
            if (-1 < HSi) {
              uVar10 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&HSi);
              if (uVar10 < nbytes) {
                lVar12 = (long)HSi;
                uVar10 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&HSi);
                BitStream::BitStream(&local_80,p + lVar12,nbytes - uVar10);
                h_00.nbytes = local_80.nbytes;
                h_00.start = local_80.start;
                h_00.p = local_80.p;
                h_00.bit_offset = local_80.bit_offset;
                h_00.bits_available = local_80.bits_available;
                readHSharedObject((QPDF *)pl,h_00);
                bVar3 = QPDFObjectHandle::isInteger(&HO);
                if (!bVar3) {
LAB_001d3b58:
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&hbp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&HO.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&HS.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&H0.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  Pl_Buffer::~Pl_Buffer(&pb);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                            (&H_items.super__Vector_base<int,_std::allocator<int>_>);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&P.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&T.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&N.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&E.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&O.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&H.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  return;
                }
                HOi = QPDFObjectHandle::getIntValueAsInt(&HO);
                if (-1 < HOi) {
                  uVar10 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&HOi);
                  if (uVar10 < nbytes) {
                    lVar12 = (long)HOi;
                    uVar10 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&HOi);
                    this_01 = &local_a8;
                    BitStream::BitStream(this_01,p + lVar12,nbytes - uVar10);
                    h_01.nbytes = local_a8.nbytes;
                    h_01.start = local_a8.start;
                    h_01.p = local_a8.p;
                    h_01.bit_offset = local_a8.bit_offset;
                    h_01.bits_available = local_a8.bits_available;
                    readHGeneric((QPDF *)this_01,h_01,(HGeneric *)(pl->_vptr_Pipeline + 0x80));
                    goto LAB_001d3b58;
                  }
                }
                pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_208,"linearization hint table",&local_211);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&oh,"/O (outline) offset is out of bounds",&local_1e1);
                damagedPDF(pQVar11,(QPDF *)local_210,&local_208,(string *)&oh);
                __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
              }
            }
            pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"linearization hint table",(allocator<char> *)&HOi);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&oh,"/S (shared object) offset is out of bounds",&local_211);
            damagedPDF(pQVar11,(QPDF *)local_210,&local_208,(string *)&oh);
            __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
        }
      }
    }
  }
LAB_001d3c79:
  pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pb,"linearization dictionary",(allocator<char> *)&oh);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"some keys in linearization dictionary are of the wrong type",
             (allocator<char> *)&H_items);
  damagedPDF(pQVar11,this,(string *)&pb,&local_208);
  __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readLinearizationData()
{
    // This function throws an exception (which is trapped by checkLinearization()) for any errors
    // that prevent loading.

    if (!isLinearized()) {
        throw std::logic_error("called readLinearizationData for file that is not linearized");
    }

    // /L is read and stored in linp by isLinearized()
    QPDFObjectHandle H = m->lindict.getKey("/H");
    QPDFObjectHandle O = m->lindict.getKey("/O");
    QPDFObjectHandle E = m->lindict.getKey("/E");
    QPDFObjectHandle N = m->lindict.getKey("/N");
    QPDFObjectHandle T = m->lindict.getKey("/T");
    QPDFObjectHandle P = m->lindict.getKey("/P");

    if (!(H.isArray() && O.isInteger() && E.isInteger() && N.isInteger() && T.isInteger() &&
          (P.isInteger() || P.isNull()))) {
        throw damagedPDF(
            "linearization dictionary",
            "some keys in linearization dictionary are of the wrong type");
    }

    // Hint table array: offset length [ offset length ]
    size_t n_H_items = toS(H.getArrayNItems());
    if (!((n_H_items == 2) || (n_H_items == 4))) {
        throw damagedPDF("linearization dictionary", "H has the wrong number of items");
    }

    std::vector<int> H_items;
    for (size_t i = 0; i < n_H_items; ++i) {
        QPDFObjectHandle oh(H.getArrayItem(toI(i)));
        if (oh.isInteger()) {
            H_items.push_back(oh.getIntValueAsInt());
        } else {
            throw damagedPDF("linearization dictionary", "some H items are of the wrong type");
        }
    }

    // H: hint table offset/length for primary and overflow hint tables
    int H0_offset = H_items.at(0);
    int H0_length = H_items.at(1);
    int H1_offset = 0;
    int H1_length = 0;
    if (H_items.size() == 4) {
        // Acrobat doesn't read or write these (as PDF 1.4), so we don't have a way to generate a
        // test case.
        // QTC::TC("qpdf", "QPDF overflow hint table");
        H1_offset = H_items.at(2);
        H1_length = H_items.at(3);
    }

    // P: first page number
    int first_page = 0;
    if (P.isInteger()) {
        QTC::TC("qpdf", "QPDF P present in lindict");
        first_page = P.getIntValueAsInt();
    } else {
        QTC::TC("qpdf", "QPDF P absent in lindict");
    }

    // Store linearization parameter data

    // Various places in the code use linp.npages, which is initialized from N, to pre-allocate
    // memory, so make sure it's accurate and bail right now if it's not.
    if (N.getIntValue() != static_cast<long long>(getAllPages().size())) {
        throw damagedPDF("linearization hint table", "/N does not match number of pages");
    }

    // file_size initialized by isLinearized()
    m->linp.first_page_object = O.getIntValueAsInt();
    m->linp.first_page_end = E.getIntValue();
    m->linp.npages = N.getIntValueAsInt();
    m->linp.xref_zero_offset = T.getIntValue();
    m->linp.first_page = first_page;
    m->linp.H_offset = H0_offset;
    m->linp.H_length = H0_length;

    // Read hint streams

    Pl_Buffer pb("hint buffer");
    QPDFObjectHandle H0 = readHintStream(pb, H0_offset, toS(H0_length));
    if (H1_offset) {
        (void)readHintStream(pb, H1_offset, toS(H1_length));
    }

    // PDF 1.4 hint tables that we ignore:

    //  /T    thumbnail
    //  /A    thread information
    //  /E    named destination
    //  /V    interactive form
    //  /I    information dictionary
    //  /C    logical structure
    //  /L    page label

    // Individual hint table offsets
    QPDFObjectHandle HS = H0.getKey("/S"); // shared object
    QPDFObjectHandle HO = H0.getKey("/O"); // outline

    auto hbp = pb.getBufferSharedPointer();
    Buffer* hb = hbp.get();
    unsigned char const* h_buf = hb->getBuffer();
    size_t h_size = hb->getSize();

    readHPageOffset(BitStream(h_buf, h_size));

    int HSi = HS.getIntValueAsInt();
    if ((HSi < 0) || (toS(HSi) >= h_size)) {
        throw damagedPDF("linearization hint table", "/S (shared object) offset is out of bounds");
    }
    readHSharedObject(BitStream(h_buf + HSi, h_size - toS(HSi)));

    if (HO.isInteger()) {
        int HOi = HO.getIntValueAsInt();
        if ((HOi < 0) || (toS(HOi) >= h_size)) {
            throw damagedPDF("linearization hint table", "/O (outline) offset is out of bounds");
        }
        readHGeneric(BitStream(h_buf + HOi, h_size - toS(HOi)), m->outline_hints);
    }
}